

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O1

JDIMENSION load_interlaced_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  JDIMENSION JVar1;
  jpeg_progress_mgr *pjVar2;
  JSAMPROW pJVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  JSAMPARRAY ppJVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  pjVar2 = cinfo->progress;
  uVar5 = cinfo->image_height;
  uVar6 = (ulong)uVar5;
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      if (pjVar2 != (jpeg_progress_mgr *)0x0) {
        pjVar2->pass_counter = uVar10;
        pjVar2->pass_limit = uVar6;
        (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
      }
      ppJVar7 = (*cinfo->mem->access_virt_sarray)
                          ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[8].buffer,(JDIMENSION)uVar10,
                           1,1);
      JVar1 = cinfo->image_width;
      if (JVar1 != 0) {
        pJVar3 = *ppJVar7;
        lVar9 = 0;
        do {
          iVar4 = LZWReadByte((gif_source_ptr)sinfo);
          pJVar3[lVar9] = (JSAMPLE)iVar4;
          lVar9 = lVar9 + 1;
        } while (JVar1 != (JDIMENSION)lVar9);
      }
      uVar10 = uVar10 + 1;
      uVar5 = cinfo->image_height;
      uVar6 = (ulong)uVar5;
    } while (uVar10 < uVar6);
  }
  if (pjVar2 != (jpeg_progress_mgr *)0x0) {
    *(int *)&pjVar2[1].progress_monitor = *(int *)&pjVar2[1].progress_monitor + 1;
  }
  sinfo->get_pixel_rows = get_interlaced_row;
  sinfo[8].buffer_height = 0;
  uVar8 = uVar5 + 7 >> 3;
  *(uint *)&sinfo[8].field_0x2c = uVar8;
  iVar4 = (uVar5 + 3 >> 3) + uVar8;
  *(int *)&sinfo[9].start_input = iVar4;
  *(uint *)((long)&sinfo[9].start_input + 4) = (uVar5 + 1 >> 2) + iVar4;
  get_interlaced_row(cinfo,sinfo);
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
load_interlaced_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register JSAMPROW sptr;
  register JDIMENSION col;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the interlaced image into the virtual array we've created. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    sptr = *(*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->interlaced_image, row, (JDIMENSION)1,
       TRUE);
    for (col = cinfo->image_width; col > 0; col--) {
      *sptr++ = (JSAMPLE)LZWReadByte(source);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Replace method pointer so subsequent calls don't come here. */
  source->pub.get_pixel_rows = get_interlaced_row;
  /* Initialize for get_interlaced_row, and perform first call on it. */
  source->cur_row_number = 0;
  source->pass2_offset = (cinfo->image_height + 7) / 8;
  source->pass3_offset = source->pass2_offset + (cinfo->image_height + 3) / 8;
  source->pass4_offset = source->pass3_offset + (cinfo->image_height + 1) / 4;

  return get_interlaced_row(cinfo, sinfo);
}